

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_temp_ext_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float fVar1;
  float fVar2;
  float __x;
  double dVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  
  pfVar4 = (float *)smpl->ctx;
  fVar1 = *pfVar4;
  fVar2 = pfVar4[1];
  if (0.0 < fVar2) {
    if (1 < cur_p->size) {
      fVar13 = fVar1 - fVar2;
      if (fVar13 <= 0.0) {
        fVar13 = 0.0;
      }
      fVar11 = pfVar4[2];
      fVar8 = logf(1.0 / (float)cur_p->size);
      llama_sampler_softmax_impl(cur_p);
      if (cur_p->size == 0) {
        fVar9 = 0.0;
      }
      else {
        lVar5 = 8;
        uVar6 = 0;
        fVar9 = 0.0;
        do {
          __x = *(float *)((long)&cur_p->data->id + lVar5);
          if (0.0 < __x) {
            fVar10 = logf(__x);
            fVar9 = fVar9 - fVar10 * __x;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar6 < cur_p->size);
      }
      fVar11 = powf(fVar9 / -fVar8,fVar11);
      llama_sampler_temp_impl(cur_p,fVar11 * ((fVar2 + fVar1) - fVar13) + fVar13);
      if (cur_p->size == 0) {
        dVar12 = 0.0;
        uVar6 = 0;
      }
      else {
        fVar1 = cur_p->data->logit;
        dVar12 = 0.0;
        lVar5 = 0;
        uVar7 = 0;
        do {
          dVar3 = exp((double)*(float *)((long)&cur_p->data->logit + lVar5) - (double)fVar1);
          *(float *)((long)&cur_p->data->p + lVar5) = (float)dVar3;
          dVar12 = dVar12 + dVar3;
          uVar7 = uVar7 + 1;
          uVar6 = cur_p->size;
          lVar5 = lVar5 + 0xc;
        } while (uVar7 < uVar6);
      }
      if (uVar6 != 0) {
        pfVar4 = &cur_p->data->p;
        do {
          *pfVar4 = (float)((double)*pfVar4 / dVar12);
          pfVar4 = pfVar4 + 3;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    return;
  }
  llama_sampler_temp_impl(cur_p,fVar1);
  return;
}

Assistant:

static void llama_sampler_temp_ext_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_temp_ext *) smpl->ctx;
    if (ctx->delta > 0) {
        const float min_temp = std::max(0.0f, ctx->temp - ctx->delta);
        const float max_temp = ctx->temp + ctx->delta;

        float exponent_val = ctx->exponent;

        // no need to do anything if there is only one (or zero) candidates
        if (cur_p->size <= 1) {
            return;
        }

        // Calculate maximum possible entropy
        float max_entropy = -logf(1.0f / cur_p->size);

        llama_sampler_softmax_impl(cur_p);

        // Calculate entropy of the softmax probabilities
        float entropy = 0.0f;
        for (size_t i = 0; i < cur_p->size; ++i) {
            float prob = cur_p->data[i].p;
            if (prob > 0.0f) { // Ensure no log(0)
                entropy -= prob * logf(prob);
            }
        }

        // Normalize the entropy (max_entropy cannot be 0 here because we checked cur_p->size != 1 above)
        float normalized_entropy = entropy / max_entropy;

        // Map the normalized entropy to the desired temperature range using the power function
        float dyn_temp = min_temp + (max_temp - min_temp) * powf(normalized_entropy, exponent_val);

    #ifdef DEBUG
        LLAMA_LOG_INFO("Your text maxtemp value is: %f\n", max_temp);
        LLAMA_LOG_INFO("Entropy: %f\n", entropy);
        LLAMA_LOG_INFO("Max Possible Entropy: %f\n", max_entropy);
        LLAMA_LOG_INFO("Normalized Entropy: %f\n", normalized_entropy);
        LLAMA_LOG_INFO("Exponent: %f\n", exponent_val);
        LLAMA_LOG_INFO("Dynamic Temperature (dyn_temp): %f\n", dyn_temp);
    #endif

        // Apply the dynamically calculated temperature scaling
        llama_sampler_temp_impl(cur_p, dyn_temp);

        // Re-compute softmax probabilities after scaling logits with dynamic temperature
        const double max_l_double = cur_p->data[0].logit;

        double cum_sum_double = 0.0;
        for (size_t i = 0; i < cur_p->size; ++i) {
            double p = exp(cur_p->data[i].logit - max_l_double);
            cur_p->data[i].p = p; // Store the scaled probability
            cum_sum_double += p;
        }

        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= cum_sum_double; // Re-normalize the probabilities
        }

    #ifdef DEBUG
        // Print the updated top 25 probabilities after temperature scaling
        LLAMA_LOG_INFO("\nUpdated Top 25 Probabilities After Dynamic Temperature Scaling (in percentages):\n");
        for (size_t i = 0; i < 25 && i < cur_p->size; ++i) {
            LLAMA_LOG_INFO("Token %zu: %f%%\n", i + 1, cur_p->data[i].p * 100.0f);
        }
    #endif
    } else {
        llama_sampler_temp_impl(cur_p, ctx->temp);
    }
}